

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O1

NETADDR * __thiscall CServerBrowserFavorites::UpdateFavorites(CServerBrowserFavorites *this)

{
  NETADDR *Addr;
  int *piVar1;
  uint uVar2;
  undefined8 uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  int iVar8;
  long lVar9;
  CFavoriteServer *pCVar10;
  CServerBrowserFavorites *pCVar11;
  CFavoriteServer *dest;
  NETADDR *pNVar12;
  
  if (((this->m_FavLookup).m_Active != true) ||
     ((this->m_FavLookup).m_HostLookup.m_Job.m_Status != 2)) {
    pNVar12 = (NETADDR *)0x0;
    goto LAB_0012d548;
  }
  iVar8 = (this->m_FavLookup).m_FavoriteIndex;
  lVar9 = (long)iVar8;
  if (lVar9 == -1) {
LAB_0012d53e:
    pNVar12 = (NETADDR *)0x0;
  }
  else {
    if ((this->m_FavLookup).m_HostLookup.m_Job.m_Result != 0) {
      if (this->m_aFavoriteServers[lVar9].m_State != 0) {
        dest = this->m_aFavoriteServers + lVar9;
        iVar8 = iVar8 + 1;
        pCVar10 = this->m_aFavoriteServers + iVar8;
        iVar8 = this->m_NumFavoriteServers - iVar8;
        goto LAB_0012d521;
      }
      this->m_aFavoriteServers[lVar9].m_State = 2;
      goto LAB_0012d53e;
    }
    Addr = &(this->m_FavLookup).m_HostLookup.m_Addr;
    pCVar10 = FindFavoriteByAddr(this,Addr,(int *)0x0);
    if (pCVar10 != (CFavoriteServer *)0x0) {
      if (pCVar10->m_State != 4) {
        str_copy(pCVar10->m_aHostname,
                 this->m_aFavoriteServers[(this->m_FavLookup).m_FavoriteIndex].m_aHostname,0x80);
        pCVar10->m_State = 4;
      }
      uVar2 = (this->m_FavLookup).m_FavoriteIndex;
      dest = this->m_aFavoriteServers + (int)uVar2;
      pCVar10 = dest + 1;
      iVar8 = ~uVar2 + this->m_NumFavoriteServers;
LAB_0012d521:
      mem_move(dest,pCVar10,iVar8 * 0xbc);
      this->m_NumFavoriteServers = this->m_NumFavoriteServers + -1;
      goto LAB_0012d53e;
    }
    if ((this->m_aFavoriteServers[(this->m_FavLookup).m_FavoriteIndex].m_State != 0) &&
       (iVar8 = net_addr_comp(&this->m_aFavoriteServers[this->m_NumFavoriteServers].m_Addr,Addr,1),
       iVar8 != 0)) {
      RemoveFavoriteEntry(this,(this->m_FavLookup).m_FavoriteIndex);
      goto LAB_0012d53e;
    }
    iVar8 = (this->m_FavLookup).m_FavoriteIndex;
    pNVar12 = &this->m_aFavoriteServers[iVar8].m_Addr;
    *(undefined8 *)(this->m_aFavoriteServers[iVar8].m_Addr.ip + 0xc) =
         *(undefined8 *)((this->m_FavLookup).m_HostLookup.m_Addr.ip + 0xc);
    uVar4 = Addr->ip[0];
    uVar5 = Addr->ip[1];
    uVar6 = Addr->ip[2];
    uVar7 = Addr->ip[3];
    uVar3 = *(undefined8 *)((this->m_FavLookup).m_HostLookup.m_Addr.ip + 4);
    pNVar12->type = Addr->type;
    pNVar12->ip[0] = uVar4;
    pNVar12->ip[1] = uVar5;
    pNVar12->ip[2] = uVar6;
    pNVar12->ip[3] = uVar7;
    *(undefined8 *)(this->m_aFavoriteServers[iVar8].m_Addr.ip + 4) = uVar3;
    this->m_aFavoriteServers[iVar8].m_State = 4;
  }
  (this->m_FavLookup).m_Active = false;
LAB_0012d548:
  if (((0 < (this->m_FavLookup).m_LookupCount) && ((this->m_FavLookup).m_Active == false)) &&
     (0 < (long)this->m_NumFavoriteServers)) {
    lVar9 = 0;
    pCVar11 = this;
    do {
      if (pCVar11->m_aFavoriteServers[0].m_State < 2) {
        (*(this->m_pEngine->super_IInterface)._vptr_IInterface[6])
                  (this->m_pEngine,&this->m_FavLookup,pCVar11,
                   (ulong)(uint)(this->m_pNetClient->super_CNetBase).m_Socket.type);
        (this->m_FavLookup).m_FavoriteIndex = (int)lVar9;
        piVar1 = &(this->m_FavLookup).m_LookupCount;
        *piVar1 = *piVar1 + -1;
        (this->m_FavLookup).m_Active = true;
        return pNVar12;
      }
      lVar9 = lVar9 + 1;
      pCVar11 = (CServerBrowserFavorites *)(pCVar11->m_aFavoriteServers + 1);
    } while (this->m_NumFavoriteServers != lVar9);
  }
  return pNVar12;
}

Assistant:

const NETADDR *CServerBrowserFavorites::UpdateFavorites()
{
	NETADDR *pResult = 0;

	// check if hostname lookup for favorites is done
	if(m_FavLookup.m_Active && m_FavLookup.m_HostLookup.m_Job.Status() == CJob::STATE_DONE)
	{
		// check if favorite has not been removed in the meanwhile
		if(m_FavLookup.m_FavoriteIndex != -1)
		{
			if(m_FavLookup.m_HostLookup.m_Job.Result() == 0)
			{
				CFavoriteServer *pEntry = FindFavoriteByAddr(m_FavLookup.m_HostLookup.m_Addr, 0);
				if(pEntry)
				{
					// address is already in the list -> acquire hostname if existing entry lacks it and drop multiple address entry
					if(pEntry->m_State != FAVSTATE_HOST)
					{
						str_copy(pEntry->m_aHostname, m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_aHostname, sizeof(pEntry->m_aHostname));
						pEntry->m_State = FAVSTATE_HOST;
					}
					RemoveFavoriteEntry(m_FavLookup.m_FavoriteIndex);
				}
				else
				{
					// address wasn't in the list yet -> add it (optional check if hostname matches given address -> drop entry on fail)
					if(m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State == FAVSTATE_LOOKUP ||
						net_addr_comp(&m_aFavoriteServers[m_NumFavoriteServers].m_Addr, &m_FavLookup.m_HostLookup.m_Addr, true) == 0)
					{
						m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_Addr = m_FavLookup.m_HostLookup.m_Addr;
						m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State = FAVSTATE_HOST;
						pResult = &m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_Addr;
					}
					else
					{
						RemoveFavoriteEntry(m_FavLookup.m_FavoriteIndex);
					}
				}
			}
			else
			{
				// hostname lookup failed
				if(m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State == FAVSTATE_LOOKUP)
				{
					m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State = FAVSTATE_INVALID;
				}
				else
				{
					RemoveFavoriteEntry(m_FavLookup.m_FavoriteIndex);
				}
			}
		}
		m_FavLookup.m_Active = false;
	}

	// add hostname lookup for favorites
	if(m_FavLookup.m_LookupCount > 0 && !m_FavLookup.m_Active)
	{
		for(int i = 0; i < m_NumFavoriteServers; i++)
		{
			if(m_aFavoriteServers[i].m_State <= FAVSTATE_LOOKUPCHECK)
			{
				m_pEngine->HostLookup(&m_FavLookup.m_HostLookup, m_aFavoriteServers[i].m_aHostname, m_pNetClient->NetType());
				m_FavLookup.m_FavoriteIndex = i;
				--m_FavLookup.m_LookupCount;
				m_FavLookup.m_Active = true;
				break;
			}
		}
	}

	return pResult;
}